

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_rm_srv_req(raft_server *this,req_msg *req)

{
  int *__args_3;
  long *plVar1;
  _func_int **pp_Var2;
  buffer *pbVar3;
  size_t sVar4;
  iterator iVar5;
  char *__s;
  long lVar6;
  _func_int *p_Var7;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  ptr<resp_msg> pVar9;
  int32 srv_id;
  int local_e0;
  undefined1 local_dc [4];
  ptr<peer> p;
  element_type *local_c8 [4];
  shared_lock<std::shared_timed_mutex> rlock;
  ptr<req_msg> leave_req;
  
  leave_req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((req[3].log_entries_.
         super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->
       super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c8[0] = (element_type *)CONCAT44(local_c8[0]._4_4_,9);
  __args_3 = (int *)((long)&(req->super_msg_base).term_ + 4);
  std::make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int&>
            ((unsigned_long *)this,(msg_type *)&leave_req,(int *)local_c8,__args_3);
  if (*(long *)(in_RDX + 0x40) - (long)*(undefined8 **)(in_RDX + 0x38) == 0x10) {
    pbVar3 = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
    sVar4 = buffer::size(pbVar3);
    if (sVar4 != 4) goto LAB_00145585;
    if (*(int *)&req[3].log_entries_.
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 3) {
      if (*(char *)((long)&req->last_log_idx_ + 1) == '\x01') {
        plVar1 = (long *)req[4].last_log_term_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&leave_req,"previous config has not committed yet",
                   (allocator<char> *)local_c8);
        (**(code **)(*plVar1 + 0x18))(plVar1,&leave_req);
      }
      else {
        pbVar3 = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
        srv_id = buffer::get_int(pbVar3);
        if (srv_id != *__args_3) {
          p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          rlock._M_pm = (mutex_type *)&req[2].super_msg_base.dst_;
          rlock._M_owns = true;
          std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)rlock._M_pm);
          iVar5 = std::
                  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)&req[1].commit_idx_,&srv_id);
          if (iVar5.
              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            plVar1 = (long *)req[4].last_log_term_;
            __s = strfmt<100>::fmt<int>((strfmt<100> *)&leave_req,srv_id);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_c8,__s,(allocator<char> *)&local_e0);
            (**(code **)(*plVar1 + 0x18))(plVar1,local_c8);
            std::__cxx11::string::~string((string *)local_c8);
          }
          else {
            std::__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> *)
                       ((long)iVar5.
                              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                              ._M_cur + 0x10));
          }
          std::shared_lock<std::shared_timed_mutex>::~shared_lock(&rlock);
          if (iVar5.
              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            local_c8[0] = ((req[3].log_entries_.
                            super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->
                          super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr;
            local_dc = (undefined1  [4])0x0;
            local_e0 = 0xe;
            lVar6 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
            rlock._M_pm = (mutex_type *)(lVar6 + -1);
            std::
            make_shared<cornerstone::req_msg,unsigned_long,cornerstone::msg_type,int&,int&,int,unsigned_long,unsigned_long&>
                      ((unsigned_long *)&leave_req,(msg_type *)local_c8,&local_e0,__args_3,&srv_id,
                       (unsigned_long *)local_dc,(unsigned_long *)&rlock);
            peer::send_req(p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,&leave_req,(rpc_handler *)&req[9].super_msg_base.type_);
            pp_Var2 = this->_vptr_raft_server;
            p_Var7 = (_func_int *)(**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
            pp_Var2[4] = p_Var7;
            *(undefined1 *)(pp_Var2 + 5) = 1;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&leave_req.
                        super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          _Var8._M_pi = extraout_RDX_00;
          goto LAB_001455ba;
        }
        plVar1 = (long *)req[4].last_log_term_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&leave_req,"cannot request to remove leader",
                   (allocator<char> *)local_c8);
        (**(code **)(*plVar1 + 0x18))(plVar1,&leave_req);
      }
    }
    else {
      plVar1 = (long *)req[4].last_log_term_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&leave_req,"this is not a leader, cannot handle RemoveServerRequest",
                 (allocator<char> *)local_c8);
      (**(code **)(*plVar1 + 0x18))(plVar1,&leave_req);
    }
  }
  else {
LAB_00145585:
    plVar1 = (long *)req[4].last_log_term_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&leave_req,
               "bad remove server request as we are expecting one log entry with value type of int",
               (allocator<char> *)local_c8);
    (**(code **)(*plVar1 + 0x18))(plVar1,&leave_req);
  }
  std::__cxx11::string::~string((string *)&leave_req);
  _Var8._M_pi = extraout_RDX;
LAB_001455ba:
  pVar9.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  pVar9.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar9.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_rm_srv_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries(req.log_entries());
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::remove_server_response, id_, leader_));
    if (entries.size() != 1 || entries[0]->get_buf().size() != sz_int)
    {
        l_->info("bad remove server request as we are expecting one log entry with value type of int");
        return resp;
    }

    if (role_ != srv_role::leader)
    {
        l_->info("this is not a leader, cannot handle RemoveServerRequest");
        return resp;
    }

    if (config_changing_)
    {
        // the previous config has not committed yet
        l_->info("previous config has not committed yet");
        return resp;
    }

    int32 srv_id = entries[0]->get_buf().get_int();
    if (srv_id == id_)
    {
        l_->info("cannot request to remove leader");
        return resp;
    }

    ptr<peer> p;
    {
        read_lock(peers_lock_);
        peer_itor pit = peers_.find(srv_id);
        if (pit == peers_.end())
        {
            l_->info(sstrfmt("server %d does not exist").fmt(srv_id));
            return resp;
        }

        p = pit->second;
    }

    ptr<req_msg> leave_req(cs_new<req_msg>(
        state_->get_term(),
        msg_type::leave_cluster_request,
        id_,
        srv_id,
        0,
        log_store_->next_slot() - 1,
        quick_commit_idx_));
    p->send_req(leave_req, ex_resp_handler_);
    resp->accept(log_store_->next_slot());
    return resp;
}